

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tuple.cc
# Opt level: O0

int __thiscall xemmai::t_tuple::f_compare(t_tuple *this,t_tuple *a_other)

{
  t_svalue *ptVar1;
  bool bVar2;
  t_svalue *ptVar3;
  t_value<xemmai::t_pointer> local_78;
  t_value<xemmai::t_pointer> local_68;
  t_value<xemmai::t_pointer> local_58;
  t_value<xemmai::t_pointer> local_48;
  t_svalue *local_38;
  t_svalue *y;
  t_svalue *x;
  size_t i;
  t_tuple *a_other_local;
  t_tuple *this_local;
  
  if (this == a_other) {
    this_local._4_4_ = 0;
  }
  else {
    i = (size_t)a_other;
    a_other_local = this;
    for (x = (t_svalue *)0x0; ptVar1 = x, x < (t_svalue *)this->v_size;
        x = (t_svalue *)((long)&(x->super_t_slot).v_p._M_b._M_p + 1)) {
      ptVar3 = (t_svalue *)f_size((t_tuple *)i);
      if (ptVar3 <= ptVar1) {
        return 1;
      }
      y = operator[](this,(size_t)x);
      local_38 = operator[]((t_tuple *)i,(size_t)x);
      ptVar1 = y;
      t_value<xemmai::t_pointer>::t_value<xemmai::t_slot>(&local_58,local_38);
      t_value<xemmai::t_slot>::f_equals((t_value<xemmai::t_slot> *)&local_48,(t_pvalue *)ptVar1);
      bVar2 = f_as<bool,xemmai::t_value<xemmai::t_pointer>>(&local_48);
      ptVar1 = y;
      if (((bVar2 ^ 0xffU) & 1) != 0) {
        t_value<xemmai::t_pointer>::t_value<xemmai::t_slot>(&local_78,local_38);
        t_value<xemmai::t_slot>::f_less((t_value<xemmai::t_slot> *)&local_68,(t_pvalue *)ptVar1);
        bVar2 = f_as<bool,xemmai::t_value<xemmai::t_pointer>>(&local_68);
        if (!bVar2) {
          return 1;
        }
        return -1;
      }
    }
    ptVar3 = (t_svalue *)f_size((t_tuple *)i);
    this_local._4_4_ = 0;
    if (ptVar1 < ptVar3) {
      this_local._4_4_ = -1;
    }
  }
  return this_local._4_4_;
}

Assistant:

int t_tuple::f_compare(const t_tuple& a_other) const
{
	if (this == &a_other) return 0;
	size_t i = 0;
	for (; i < v_size; ++i) {
		if (i >= a_other.f_size()) return 1;
		auto& x = (*this)[i];
		auto& y = a_other[i];
		if (!f_as<bool>(x.f_equals(y))) return f_as<bool>(x.f_less(y)) ? -1 : 1;
	}
	return i < a_other.f_size() ? -1 : 0;
}